

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::AggregateStateTypeInfo::Deserialize(AggregateStateTypeInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  AggregateStateTypeInfo *pAVar3;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar4;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar5;
  shared_ptr<duckdb::AggregateStateTypeInfo,_true> result;
  LogicalType val;
  shared_ptr<duckdb::AggregateStateTypeInfo,_true> local_88;
  undefined1 local_78 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  AggregateStateTypeInfo *local_38;
  
  pAVar3 = (AggregateStateTypeInfo *)operator_new(0x88);
  AggregateStateTypeInfo(pAVar3);
  local_88.internal.super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pAVar3;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::AggregateStateTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_88.internal.
              super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pAVar3);
  pAVar3 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_88);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"function_name");
  if ((char)uVar1 == '\0') {
    local_78._8_8_ = (element_type *)0x0;
    local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
    local_78._0_8_ = (pointer)(local_78 + 0x10);
    ::std::__cxx11::string::operator=((string *)&pAVar3->state_type,(string *)local_78);
    if ((pointer)local_78._0_8_ == (pointer)(local_78 + 0x10)) goto LAB_01783d8d;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    ::std::__cxx11::string::operator=((string *)&pAVar3->state_type,(string *)local_78);
    if ((pointer)local_78._0_8_ == (pointer)(local_78 + 0x10)) goto LAB_01783d8d;
  }
  operator_delete((void *)local_78._0_8_);
LAB_01783d8d:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pAVar3 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_88);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0xc9,"return_type",&(pAVar3->state_type).return_type);
  pAVar3 = shared_ptr<duckdb::AggregateStateTypeInfo,_true>::operator->(&local_88);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"bound_argument_types");
  if ((char)uVar1 == '\0') {
    local_78._0_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78._16_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_78);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  }
  else {
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = this;
    iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        LogicalType::Deserialize((LogicalType *)local_78,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>(&local_58,(LogicalType *)local_78);
        LogicalType::~LogicalType((LogicalType *)local_78);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    local_78._0_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78._16_8_ =
         (pAVar3->state_type).bound_argument_types.
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pAVar3->state_type).bound_argument_types.
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_78);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
    this = local_38;
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_88.internal.
       super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_88.internal.
       super___shared_ptr<duckdb::AggregateStateTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> AggregateStateTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<AggregateStateTypeInfo>(new AggregateStateTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->state_type.function_name);
	deserializer.ReadProperty<LogicalType>(201, "return_type", result->state_type.return_type);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(202, "bound_argument_types", result->state_type.bound_argument_types);
	return std::move(result);
}